

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_cbs_auth.c
# Opt level: O0

int authentication_set_option(AUTHENTICATION_HANDLE authentication_handle,char *name,void *value)

{
  int iVar1;
  OPTIONHANDLER_RESULT OVar2;
  LOGGER_LOG p_Var3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  AUTHENTICATION_INSTANCE_conflict *instance;
  LOGGER_LOG l;
  int result;
  void *value_local;
  char *name_local;
  AUTHENTICATION_HANDLE authentication_handle_local;
  
  if (((authentication_handle == (AUTHENTICATION_HANDLE)0x0) || (name == (char *)0x0)) ||
     (value == (void *)0x0)) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_cbs_auth.c"
                ,"authentication_set_option",0x26c,1,
                "authentication_set_option failed (one of the followin are NULL: authentication_handle=%p, name=%p, value=%p)"
                ,authentication_handle,name,value);
    }
    l._4_4_ = 0x26d;
  }
  else {
    iVar1 = strcmp("cbs_request_timeout_secs",name);
    if (iVar1 == 0) {
      authentication_handle->cbs_request_timeout_secs = *value;
      l._4_4_ = 0;
    }
    else {
      iVar1 = strcmp("saved_authentication_options",name);
      if (iVar1 == 0) {
        OVar2 = OptionHandler_FeedOptions((OPTIONHANDLER_HANDLE)value,authentication_handle);
        if (OVar2 == OPTIONHANDLER_OK) {
          l._4_4_ = 0;
        }
        else {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_cbs_auth.c"
                      ,"authentication_set_option",0x27c,1,
                      "authentication_set_option failed (OptionHandler_FeedOptions failed)");
          }
          l._4_4_ = 0x27d;
        }
      }
      else {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_cbs_auth.c"
                    ,"authentication_set_option",0x286,1,
                    "authentication_set_option failed (option with name \'%s\' is not suppported)",
                    name);
        }
        l._4_4_ = 0x287;
      }
    }
  }
  return l._4_4_;
}

Assistant:

int authentication_set_option(AUTHENTICATION_HANDLE authentication_handle, const char* name, void* value)
{
    int result;

    if (authentication_handle == NULL || name == NULL || value == NULL)
    {
        LogError("authentication_set_option failed (one of the followin are NULL: authentication_handle=%p, name=%p, value=%p)",
            authentication_handle, name, value);
        result = MU_FAILURE;
    }
    else
    {
        AUTHENTICATION_INSTANCE* instance = (AUTHENTICATION_INSTANCE*)authentication_handle;

        if (strcmp(AUTHENTICATION_OPTION_CBS_REQUEST_TIMEOUT_SECS, name) == 0)
        {
            instance->cbs_request_timeout_secs = *((size_t*)value);
            result = RESULT_OK;
        }
        else if (strcmp(AUTHENTICATION_OPTION_SAVED_OPTIONS, name) == 0)
        {
            if (OptionHandler_FeedOptions((OPTIONHANDLER_HANDLE)value, authentication_handle) != OPTIONHANDLER_OK)
            {
                LogError("authentication_set_option failed (OptionHandler_FeedOptions failed)");
                result = MU_FAILURE;
            }
            else
            {
                result = RESULT_OK;
            }
        }
        else
        {
            LogError("authentication_set_option failed (option with name '%s' is not suppported)", name);
            result = MU_FAILURE;
        }
    }

    return result;
}